

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O0

void __thiscall merc::KeywordNode::~KeywordNode(KeywordNode *this)

{
  KeywordNode *this_local;
  
  ~KeywordNode(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

~KeywordNode() = default;